

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O0

void __thiscall
BamTools::ConvertTool::ConvertToolPrivate::PrintYaml(ConvertToolPrivate *this,BamAlignment *a)

{
  bool bVar1;
  ostream *poVar2;
  void *pvVar3;
  reference pvVar4;
  ostream *poVar5;
  reference pCVar6;
  string *in_RSI;
  __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
  *in_RDI;
  CigarOp *op;
  const_iterator cigarEnd;
  const_iterator cigarIter;
  const_iterator cigarBegin;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *cigarData;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *in_stack_ffffffffffffffd0;
  __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
  local_28;
  CigarOp *local_20;
  string *local_18;
  string *local_10;
  
  local_10 = in_RSI;
  poVar2 = std::operator<<((ostream *)(in_RDI + 4),"---");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)(in_RDI + 4),local_10);
  poVar2 = std::operator<<(poVar2,':');
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)(in_RDI + 4),"   ");
  poVar2 = std::operator<<(poVar2,"AlndBases: ");
  poVar2 = std::operator<<(poVar2,local_10 + 0x48);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)(in_RDI + 4),"   ");
  poVar2 = std::operator<<(poVar2,"Qualities: ");
  poVar2 = std::operator<<(poVar2,local_10 + 0x68);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)(in_RDI + 4),"   ");
  poVar2 = std::operator<<(poVar2,"Name: ");
  poVar2 = std::operator<<(poVar2,local_10);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)(in_RDI + 4),"   ");
  poVar2 = std::operator<<(poVar2,"Length: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,*(int *)(local_10 + 0x20));
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)(in_RDI + 4),"   ");
  poVar2 = std::operator<<(poVar2,"TagData: ");
  poVar2 = std::operator<<(poVar2,local_10 + 0x88);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)(in_RDI + 4),"   ");
  poVar2 = std::operator<<(poVar2,"RefID: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,*(int *)(local_10 + 0xa8));
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)(in_RDI + 4),"   ");
  poVar2 = std::operator<<(poVar2,"RefName: ");
  pvVar4 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::operator[]
                     ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)(in_RDI + 1),
                      (long)*(int *)(local_10 + 0xa8));
  poVar5 = std::operator<<(poVar2,(string *)pvVar4);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)(in_RDI + 4),"   ");
  poVar5 = std::operator<<(poVar5,"Position: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar5,*(int *)(local_10 + 0xac));
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)(in_RDI + 4),"   ");
  poVar5 = std::operator<<(poVar5,"Bin: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar5,*(ushort *)(local_10 + 0xb0));
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)(in_RDI + 4),"   ");
  poVar5 = std::operator<<(poVar5,"MapQuality: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar5,*(ushort *)(local_10 + 0xb2));
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)(in_RDI + 4),"   ");
  poVar5 = std::operator<<(poVar5,"AlignmentFlag: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar5,*(uint *)(local_10 + 0xb4));
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)(in_RDI + 4),"   ");
  poVar5 = std::operator<<(poVar5,"MateRefID: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar5,*(int *)(local_10 + 0xd0));
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)(in_RDI + 4),"   ");
  poVar5 = std::operator<<(poVar5,"MatePosition: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar5,*(int *)(local_10 + 0xd4));
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)(in_RDI + 4),"   ");
  poVar5 = std::operator<<(poVar5,"InsertSize: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar5,*(int *)(local_10 + 0xd8));
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)(in_RDI + 4),"   ");
  poVar5 = std::operator<<(poVar5,"Filename: ");
  poVar5 = std::operator<<(poVar5,local_10 + 0xe0);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  local_18 = local_10 + 0xb8;
  bVar1 = std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::empty
                    (in_stack_ffffffffffffffd0);
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)(in_RDI + 4),"   ");
    std::operator<<(poVar5,"Cigar: ");
    local_28._M_current =
         (CigarOp *)
         std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::begin
                   ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)poVar2);
    local_20 = local_28._M_current;
    std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::end
              ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)poVar2);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (in_RDI,(__normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                                 *)poVar2);
      if (!bVar1) break;
      pCVar6 = __gnu_cxx::
               __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
               ::operator*(&local_28);
      poVar5 = (ostream *)std::ostream::operator<<(in_RDI + 4,pCVar6->Length);
      std::operator<<(poVar5,pCVar6->Type);
      __gnu_cxx::
      __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
      ::operator++(&local_28);
    }
    std::ostream::operator<<(in_RDI + 4,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void ConvertTool::ConvertToolPrivate::PrintYaml(const BamAlignment& a)
{

    // write alignment name
    m_out << "---" << std::endl;
    m_out << a.Name << ':' << std::endl;

    // write alignment data
    m_out << "   "
          << "AlndBases: " << a.AlignedBases << std::endl;
    m_out << "   "
          << "Qualities: " << a.Qualities << std::endl;
    m_out << "   "
          << "Name: " << a.Name << std::endl;
    m_out << "   "
          << "Length: " << a.Length << std::endl;
    m_out << "   "
          << "TagData: " << a.TagData << std::endl;
    m_out << "   "
          << "RefID: " << a.RefID << std::endl;
    m_out << "   "
          << "RefName: " << m_references[a.RefID].RefName << std::endl;
    m_out << "   "
          << "Position: " << a.Position << std::endl;
    m_out << "   "
          << "Bin: " << a.Bin << std::endl;
    m_out << "   "
          << "MapQuality: " << a.MapQuality << std::endl;
    m_out << "   "
          << "AlignmentFlag: " << a.AlignmentFlag << std::endl;
    m_out << "   "
          << "MateRefID: " << a.MateRefID << std::endl;
    m_out << "   "
          << "MatePosition: " << a.MatePosition << std::endl;
    m_out << "   "
          << "InsertSize: " << a.InsertSize << std::endl;
    m_out << "   "
          << "Filename: " << a.Filename << std::endl;

    // write Cigar data
    const std::vector<CigarOp>& cigarData = a.CigarData;
    if (!cigarData.empty()) {
        m_out << "   "
              << "Cigar: ";
        std::vector<CigarOp>::const_iterator cigarBegin = cigarData.begin();
        std::vector<CigarOp>::const_iterator cigarIter = cigarBegin;
        std::vector<CigarOp>::const_iterator cigarEnd = cigarData.end();
        for (; cigarIter != cigarEnd; ++cigarIter) {
            const CigarOp& op = (*cigarIter);
            m_out << op.Length << op.Type;
        }
        m_out << std::endl;
    }
}